

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O0

void __thiscall EventLoopThread::~EventLoopThread(EventLoopThread *this)

{
  EventLoopThread *this_local;
  
  this->exiting_ = true;
  if (this->loop_ != (EventLoop *)0x0) {
    EventLoop::quit(this->loop_);
    Thread::join(&this->thread_);
  }
  Condition::~Condition(&this->cond_);
  MutexLock::~MutexLock(&this->mutex_);
  Thread::~Thread(&this->thread_);
  noncopyable::~noncopyable((noncopyable *)this);
  return;
}

Assistant:

EventLoopThread::~EventLoopThread() {
    exiting_ = true;
    if (loop_ != NULL) {
        loop_->quit();
        thread_.join();
    }
}